

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O1

void __thiscall MT32Emu::Synth::refreshSystemReverbParameters(Synth *this)

{
  MemParams *pMVar1;
  BReverbModel *pBVar2;
  long lVar3;
  BReverbModel *pBVar4;
  
  if (this->reverbOverridden == false) {
    (*this->reportHandler->_vptr_ReportHandler[0xb])
              (this->reportHandler,(ulong)(this->mt32ram->system).reverbMode);
    (*this->reportHandler->_vptr_ReportHandler[0xc])
              (this->reportHandler,(ulong)(this->mt32ram->system).reverbTime);
    (*this->reportHandler->_vptr_ReportHandler[0xd])
              (this->reportHandler,(ulong)(this->mt32ram->system).reverbLevel);
    pMVar1 = this->mt32ram;
    pBVar2 = this->reverbModel;
    if (((pMVar1->system).reverbTime == '\0') && ((pMVar1->system).reverbLevel == '\0')) {
      pBVar4 = (BReverbModel *)0x0;
    }
    else {
      pBVar4 = this->reverbModels[(pMVar1->system).reverbMode];
    }
    this->reverbModel = pBVar4;
    if (pBVar4 != pBVar2) {
      if (this->extensions->preallocatedReverbMemory == true) {
        lVar3 = 0x28;
      }
      else {
        if (pBVar2 != (BReverbModel *)0x0) {
          (*pBVar2->_vptr_BReverbModel[4])(pBVar2);
        }
        pBVar4 = this->reverbModel;
        lVar3 = 0x18;
      }
      if (pBVar4 != (BReverbModel *)0x0) {
        (**(code **)((long)pBVar4->_vptr_BReverbModel + lVar3))();
      }
    }
    pBVar2 = this->reverbModel;
    if (pBVar2 != (BReverbModel *)0x0) {
      (*pBVar2->_vptr_BReverbModel[6])
                (pBVar2,(ulong)(this->mt32ram->system).reverbTime,
                 (ulong)(this->mt32ram->system).reverbLevel);
      return;
    }
  }
  return;
}

Assistant:

void Synth::refreshSystemReverbParameters() {
#if MT32EMU_MONITOR_SYSEX > 0
	printDebug(" Reverb: mode=%d, time=%d, level=%d", mt32ram.system.reverbMode, mt32ram.system.reverbTime, mt32ram.system.reverbLevel);
#endif
	if (reverbOverridden) {
#if MT32EMU_MONITOR_SYSEX > 0
		printDebug(" (Reverb overridden - ignoring)");
#endif
		return;
	}
	reportHandler->onNewReverbMode(mt32ram.system.reverbMode);
	reportHandler->onNewReverbTime(mt32ram.system.reverbTime);
	reportHandler->onNewReverbLevel(mt32ram.system.reverbLevel);

	BReverbModel *oldReverbModel = reverbModel;
	if (mt32ram.system.reverbTime == 0 && mt32ram.system.reverbLevel == 0) {
		// Setting both time and level to 0 effectively disables wet reverb output on real devices.
		// Take a shortcut in this case to reduce CPU load.
		reverbModel = NULL;
	} else {
		reverbModel = reverbModels[mt32ram.system.reverbMode];
	}
	if (reverbModel != oldReverbModel) {
		if (extensions.preallocatedReverbMemory) {
			if (isReverbEnabled()) {
				reverbModel->mute();
			}
		} else {
			if (oldReverbModel != NULL) {
				oldReverbModel->close();
			}
			if (isReverbEnabled()) {
				reverbModel->open();
			}
		}
	}
	if (isReverbEnabled()) {
		reverbModel->setParameters(mt32ram.system.reverbTime, mt32ram.system.reverbLevel);
	}
}